

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImVec2 InputTextCalcTextSizeW
                 (ImWchar *text_begin,ImWchar *text_end,ImWchar **remaining,ImVec2 *out_offset,
                 bool stop_on_new_line)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 *in_RCX;
  undefined8 *in_RDX;
  ushort *in_RSI;
  ushort *in_RDI;
  byte in_R8B;
  float char_width;
  uint c;
  ImWchar *s;
  float line_width;
  float scale;
  float line_height;
  ImFont *font;
  ImGuiContext *g;
  ImVec2 text_size;
  ImVec2 local_68;
  float local_60;
  uint local_5c;
  ushort *puVar4;
  undefined4 in_stack_ffffffffffffffb0;
  float rhs;
  ImVec2 local_8;
  
  fVar1 = GImGui->FontSize;
  fVar2 = GImGui->Font->FontSize;
  ImVec2::ImVec2(&local_8,0.0,0.0);
  rhs = 0.0;
  do {
    while( true ) {
      puVar4 = in_RDI;
      if (in_RSI <= in_RDI) goto LAB_00243be6;
      puVar4 = in_RDI + 1;
      local_5c = (uint)*in_RDI;
      in_RDI = puVar4;
      if (local_5c == 10) break;
      if (local_5c != 0xd) {
        local_60 = ImFont::GetCharAdvance
                             ((ImFont *)CONCAT44(rhs,in_stack_ffffffffffffffb0),
                              (ImWchar)((ulong)puVar4 >> 0x30));
        local_60 = local_60 * (fVar1 / fVar2);
        rhs = local_60 + rhs;
      }
    }
    local_8.x = ImMax<float>(local_8.x,rhs);
    local_8.y = fVar1 + local_8.y;
    rhs = 0.0;
  } while ((in_R8B & 1) == 0);
LAB_00243be6:
  if (local_8.x < rhs) {
    local_8.x = rhs;
  }
  if (in_RCX != (ImVec2 *)0x0) {
    ImVec2::ImVec2(&local_68,rhs,local_8.y + fVar1);
    *in_RCX = local_68;
  }
  if ((0.0 < rhs) || ((local_8.y == 0.0 && (!NAN(local_8.y))))) {
    local_8.y = fVar1 + local_8.y;
  }
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = puVar4;
  }
  IVar3.y = local_8.y;
  IVar3.x = local_8.x;
  return IVar3;
}

Assistant:

static ImVec2 InputTextCalcTextSizeW(const ImWchar* text_begin, const ImWchar* text_end, const ImWchar** remaining, ImVec2* out_offset, bool stop_on_new_line)
{
    ImGuiContext& g = *GImGui;
    ImFont* font = g.Font;
    const float line_height = g.FontSize;
    const float scale = line_height / font->FontSize;

    ImVec2 text_size = ImVec2(0,0);
    float line_width = 0.0f;

    const ImWchar* s = text_begin;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)(*s++);
        if (c == '\n')
        {
            text_size.x = ImMax(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0.0f;
            if (stop_on_new_line)
                break;
            continue;
        }
        if (c == '\r')
            continue;

        const float char_width = font->GetCharAdvance((ImWchar)c) * scale;
        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (out_offset)
        *out_offset = ImVec2(line_width, text_size.y + line_height);  // offset allow for the possibility of sitting after a trailing \n

    if (line_width > 0 || text_size.y == 0.0f)                        // whereas size.y will ignore the trailing \n
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}